

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

try_get_result_type * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::try_get
          (try_get_result_type *__return_storage_ptr__,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  long *plVar1;
  long lVar2;
  qsbr_ptr<const_std::byte> qVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_00;
  uintptr_t uVar7;
  find_result fVar8;
  qsbr_ptr_span<const_std::byte> local_88;
  undefined1 local_78 [8];
  value_view val_view;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_60;
  art_key_type remaining_key;
  read_critical_section parent_critical_section;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aStack_40;
  read_critical_section node_critical_section;
  
  optimistic_lock::try_read_lock((optimistic_lock *)&remaining_key);
  if (remaining_key.field_0 != 0) {
    uVar7 = (this->root).value._M_i.tagged_ptr;
    if (uVar7 == 0) {
      if (*(long *)((long)remaining_key.field_0 + 8) < 1) {
LAB_0015eda8:
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      if (parent_critical_section.lock == *(optimistic_lock **)remaining_key.field_0) {
        LOCK();
        plVar1 = (long *)((long)remaining_key.field_0 + 8);
        lVar2 = *plVar1;
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (SBORROW8(lVar2,1) != *plVar1 < 0) {
LAB_0015edc7:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        remaining_key.field_0 =
             (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)(array<std::byte,_8UL>)0x0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>
                 ._M_payload + 0x10) = 0;
        (__return_storage_ptr__->
        super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
        .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
        _M_engaged = true;
        goto LAB_0015ed3b;
      }
      optimistic_lock::dec_read_lock_count((optimistic_lock *)remaining_key.field_0);
      remaining_key.field_0 =
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)(array<std::byte,_8UL>)0x0;
    }
    else {
      bVar4 = optimistic_lock::read_critical_section::check((read_critical_section *)&remaining_key)
      ;
      if (bVar4) {
        val_view._M_extent._M_extent_value = (size_t)k.field_0;
        local_60 = k.field_0;
        while( true ) {
          this_00 = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                    (uVar7 & 0xfffffffffffffff8);
          optimistic_lock::try_read_lock((optimistic_lock *)&aStack_40.key_bytes);
          if ((long *)aStack_40.key == (long *)0x0) break;
          if (*(long *)((long)remaining_key.field_0 + 8) < 1) goto LAB_0015eda8;
          if (parent_critical_section.lock != *(optimistic_lock **)remaining_key.field_0) {
            optimistic_lock::dec_read_lock_count((optimistic_lock *)remaining_key.field_0);
            remaining_key.field_0 =
                 (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                 (array<std::byte,_8UL>)0x0;
            break;
          }
          LOCK();
          plVar1 = (long *)((long)remaining_key.field_0 + 8);
          lVar2 = *plVar1;
          *plVar1 = *plVar1 + -1;
          UNLOCK();
          if (SBORROW8(lVar2,1) != *plVar1 < 0) goto LAB_0015edc7;
          remaining_key.field_0 =
               (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
               (array<std::byte,_8UL>)0x0;
          if ((uVar7 & 7) == 0) {
            bVar4 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::matches
                              (this_00,(art_key_type)val_view._M_extent._M_extent_value);
            if (bVar4) {
              val_view._M_ptr = (pointer)(ulong)this_00->value_size;
              local_78 = (undefined1  [8])(this_00->data + this_00->key_size);
              if (*(long *)(aStack_40.key + 8) < 1) goto LAB_0015eda8;
              if (node_critical_section.lock == *(optimistic_lock **)aStack_40) {
                LOCK();
                plVar1 = (long *)(aStack_40.key + 8);
                lVar2 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar2,1) != *plVar1 < 0) goto LAB_0015edc7;
                aStack_40.key = 0;
                qsbr_ptr_span<const_std::byte>::qsbr_ptr_span
                          (&local_88,(span<const_std::byte,_18446744073709551615UL> *)local_78);
                qVar3.ptr = local_88.start.ptr;
                local_88.start.ptr = (pointer)0x0;
                *(pointer *)
                 &(__return_storage_ptr__->
                  super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>
                  ._M_payload = qVar3.ptr;
                *(size_t *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>
                         ._M_payload + 8) = local_88.length;
                *(undefined1 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>
                         ._M_payload + 0x10) = 1;
                (__return_storage_ptr__->
                super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>
                ._M_engaged = true;
                qsbr_ptr<const_std::byte>::~qsbr_ptr(&local_88.start);
                goto LAB_0015ed32;
              }
            }
            else {
              if (*(long *)(aStack_40.key + 8) < 1) goto LAB_0015eda8;
              if (node_critical_section.lock == *(optimistic_lock **)aStack_40) goto LAB_0015ed18;
            }
LAB_0015ed9c:
            optimistic_lock::dec_read_lock_count((optimistic_lock *)aStack_40);
            aStack_40.key = 0;
            break;
          }
          bVar5 = detail::
                  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                            *)&this_00->key_size);
          uVar6 = detail::
                  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                       *)&this_00->key_size,local_60.key);
          if (uVar6 < bVar5) {
LAB_0015ec35:
            if (*(long *)(aStack_40.key + 8) < 1) goto LAB_0015eda8;
            if (node_critical_section.lock != *(optimistic_lock **)aStack_40) goto LAB_0015ed9c;
LAB_0015ed18:
            LOCK();
            plVar1 = (long *)(aStack_40.key + 8);
            lVar2 = *plVar1;
            *plVar1 = *plVar1 + -1;
            UNLOCK();
            if (SBORROW8(lVar2,1) != *plVar1 < 0) goto LAB_0015edc7;
            aStack_40.key = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>
                     ._M_payload + 0x10) = 0;
            (__return_storage_ptr__->
            super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
            .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
            _M_engaged = true;
            goto LAB_0015ed32;
          }
          if (uVar6 != bVar5) {
            __assert_fail("shared_key_prefix_length == key_prefix_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x6d4,
                          "typename olc_db<Key, Value>::try_get_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_get(art_key_type) const [Key = unsigned long, Value = std::span<const std::byte>]"
                         );
          }
          detail::basic_art_key<unsigned_long>::shift_right
                    ((basic_art_key<unsigned_long> *)&local_60.key_bytes,(ulong)bVar5);
          fVar8 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                  ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                *)this_00,(node_type)uVar7 & (I256|I48),
                               local_60.key_bytes._M_elems[0]);
          if (fVar8.second ==
              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *
              )0x0) goto LAB_0015ec35;
          uVar7 = ((fVar8.second)->value)._M_i.tagged_ptr;
          remaining_key.field_0 =
               (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
               (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
               aStack_40.key_bytes._M_elems;
          parent_critical_section.lock = node_critical_section.lock;
          aStack_40.key = 0;
          local_60.key = local_60.key >> 8;
          bVar4 = optimistic_lock::read_critical_section::check
                            ((read_critical_section *)&remaining_key);
          if (!bVar4) break;
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)&aStack_40.key_bytes);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
        .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
        _M_engaged = false;
LAB_0015ed32:
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)&aStack_40.key_bytes);
        goto LAB_0015ed3b;
      }
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_engaged =
       false;
LAB_0015ed3b:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&remaining_key);
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::try_get_result_type olc_db<Key, Value>::try_get(
    art_key_type k) const noexcept {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  detail::olc_node_ptr node{root.load()};  // load root into [node].

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {  // special path if empty tree.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock())) {
      // LCOV_EXCL_START
      spin_wait_loop_body();
      return {};
      // LCOV_EXCL_STOP
    }
    // return an empty result (breaks out of caller's while(true) loop)
    return std::make_optional<get_result>(std::nullopt);
  }

  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto remaining_key{k};

  while (true) {
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.ptr<leaf_type*>()};
      if (leaf->matches(k)) {
        const auto val_view{leaf->get_value_view()};
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        return qsbr_ptr_span<const std::byte>{val_view};
      }
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    auto* const inode{node.ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_key_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_key_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    UNODB_DETAIL_ASSERT(shared_key_prefix_length == key_prefix_length);

    remaining_key.shift_right(key_prefix_length);

    const auto* const child_in_parent{
        inode->find_child(node_type, remaining_key[0]).second};

    if (child_in_parent == nullptr) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}